

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> local_2828;
  duration<long,_std::ratio<1L,_1L>_> local_2820;
  rep local_2818;
  rep totalTime;
  time_point end;
  string cmd_1;
  string local_27e8 [32];
  undefined1 local_27c8 [8];
  vector<int,_std::allocator<int>_> keys;
  PutDelayTest putDelayTest;
  time_point start;
  string cmd;
  string local_68 [55];
  allocator local_31;
  string local_30 [8];
  string path;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"../data",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string(local_68,local_30);
  bVar1 = utils::dirExists((string *)local_68);
  std::__cxx11::string::~string(local_68);
  if (bVar1) {
    std::operator+((char *)&start,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"rm -rf ");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    system(pcVar2);
    std::__cxx11::string::~string((string *)&start);
  }
  putDelayTest._10008_8_ = std::chrono::_V2::system_clock::now();
  PutDelayTest::PutDelayTest
            ((PutDelayTest *)
             &keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,1000,false);
  PutDelayTest::startTest
            ((vector<int,_std::allocator<int>_> *)local_27c8,
             (PutDelayTest *)
             &keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  GetDelayTest::startTest((vector<int,_std::allocator<int>_> *)local_27c8);
  DeleteDelayTest::startTest((vector<int,_std::allocator<int>_> *)local_27c8);
  std::__cxx11::string::string(local_27e8,local_30);
  bVar1 = utils::dirExists((string *)local_27e8);
  std::__cxx11::string::~string(local_27e8);
  if (bVar1) {
    std::operator+((char *)&end,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"rm -rf ");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    system(pcVar2);
    std::__cxx11::string::~string((string *)&end);
  }
  totalTime = std::chrono::_V2::system_clock::now();
  local_2828.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&totalTime,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&putDelayTest.verbose);
  local_2820.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      (&local_2828);
  local_2818 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_2820);
  poVar3 = std::operator<<((ostream *)&std::cout,">>>>> Summary <<<<<");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"It takes ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2818);
  poVar3 = std::operator<<(poVar3,"s to complete the test.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_27c8);
  PutDelayTest::~PutDelayTest
            ((PutDelayTest *)
             &keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
  string path = "../data";
  if (utils::dirExists(path)) {
    string cmd = "rm -rf " + path;
    system(cmd.c_str());
  }

  auto start = high_resolution_clock::now();
  PutDelayTest putDelayTest(1000, false);
  auto keys = putDelayTest.startTest();

  GetDelayTest::startTest(keys);
  DeleteDelayTest::startTest(keys);

  if (utils::dirExists(path)) {
    string cmd = "rm -rf " + path;
    system(cmd.c_str());
  }

  auto end = high_resolution_clock::now();
  auto totalTime = duration_cast<seconds>(end - start).count();

  cout << ">>>>> Summary <<<<<" << endl;
  cout << "It takes " << totalTime << "s to complete the test." << endl;
}